

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::AtomicCompSwapCase::init
          (AtomicCompSwapCase *this,EVP_PKEY_CTX *ctx)

{
  TextureType type;
  bool bVar1;
  int extraout_EAX;
  ContextInfo *pCVar2;
  RenderContext *pRVar3;
  NotSupportedError *this_00;
  allocator<char> local_39;
  string local_38;
  deUint32 local_18;
  ContextType local_14;
  AtomicCompSwapCase *local_10;
  AtomicCompSwapCase *this_local;
  
  local_10 = this;
  pCVar2 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(pCVar2,"GL_OES_shader_image_atomic");
  if (!bVar1) {
    pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    local_14.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
    local_18 = (deUint32)glu::ApiType::es(3,2);
    bVar1 = glu::contextSupports(local_14,(ApiType)local_18);
    if (!bVar1) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Test requires OES_shader_image_atomic extension",&local_39);
      tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  pCVar2 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
  type = this->m_imageType;
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  checkTextureTypeExtensions(pCVar2,type,pRVar3);
  return extraout_EAX;
}

Assistant:

void AtomicCompSwapCase::init (void)
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_OES_shader_image_atomic") && !glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
		throw tcu::NotSupportedError("Test requires OES_shader_image_atomic extension");

	checkTextureTypeExtensions(m_context.getContextInfo(), m_imageType, m_context.getRenderContext());
}